

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UniformCollection::~UniformCollection
          (UniformCollection *this)

{
  pointer ppSVar1;
  StructType *this_00;
  pointer this_01;
  int i;
  long lVar2;
  
  for (lVar2 = 0;
      ppSVar1 = (this->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->m_structTypes).
                                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3);
      lVar2 = lVar2 + 1) {
    this_00 = ppSVar1[lVar2];
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
    }
    operator_delete(this_00,0x38);
  }
  std::_Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::
  ~_Vector_base(&(this->m_structTypes).
                 super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
               );
  std::_Destroy<deqp::gles3::Functional::(anonymous_namespace)::Uniform*>
            ((this->m_uniforms).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_uniforms).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this_01 = (this->m_uniforms).
            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_uniforms).
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_01;
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ::_M_deallocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
                   *)this_01,(pointer)(lVar2 / 0x38),lVar2 % 0x38);
  return;
}

Assistant:

~UniformCollection	(void)
	{
		for (int i = 0; i < (int)m_structTypes.size(); i++)
			delete m_structTypes[i];
	}